

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O3

bool validateblock(char *s)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  
  uVar3 = 0;
  do {
    bVar1 = *s;
    iVar2 = (int)uVar3;
    if (bVar1 < 0x2f) {
      if (bVar1 < 0x28) {
        if (bVar1 == 0x22) {
          s = parsestring((char *)((byte *)s + 1));
          if (*s != 0x22) {
            return false;
          }
        }
        else {
          if (bVar1 == 0) {
            return iVar2 == 0;
          }
          if (bVar1 == 0xc) {
            return false;
          }
        }
      }
      else if (bVar1 == 0x28) {
LAB_0012c362:
        if (99 < iVar2) {
          return false;
        }
        uVar3 = (ulong)(iVar2 + 1);
        validateblock::brakstack[iVar2] = bVar1;
      }
      else if (bVar1 == 0x29) {
        if (iVar2 < 1) {
          return false;
        }
        uVar3 = (ulong)(iVar2 - 1);
        if (validateblock::brakstack[uVar3] != '(') {
          return false;
        }
      }
    }
    else if (bVar1 == 0x2f) {
      if (((byte *)s)[1] == 0x2f) {
        return false;
      }
    }
    else if (bVar1 == 0x5d) {
      if (iVar2 < 1) {
        return false;
      }
      uVar3 = (ulong)(iVar2 - 1);
      if (validateblock::brakstack[uVar3] != '[') {
        return false;
      }
    }
    else if (bVar1 == 0x5b) goto LAB_0012c362;
    s = (char *)((byte *)s + 1);
  } while( true );
}

Assistant:

bool validateblock(const char *s)
{
    const int maxbrak = 100;
    static char brakstack[maxbrak];
    int brakdepth = 0;
    for(; *s; s++) switch(*s)
    {
        case '[': case '(': if(brakdepth >= maxbrak) return false; brakstack[brakdepth++] = *s; break;
        case ']': if(brakdepth <= 0 || brakstack[--brakdepth] != '[') return false; break;
        case ')': if(brakdepth <= 0 || brakstack[--brakdepth] != '(') return false; break;
        case '"': s = parsestring(s + 1); if(*s != '"') return false; break;
        case '/': if(s[1] == '/') return false; break;
        case '\f': return false;
    }
    return brakdepth == 0;
}